

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-tracer.cpp
# Opt level: O3

void __thiscall test_tracer::test_method(test_tracer *this)

{
  int iVar1;
  bool bVar2;
  string *psVar3;
  long lVar4;
  string *psVar5;
  string *psVar6;
  undefined8 uVar7;
  long *plVar8;
  long *plVar9;
  string basename;
  string rootdir;
  string suffix;
  undefined8 local_d0;
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  psVar3 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Tracer","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"my-tracer","");
  lVar4 = dynamicgraph::FactoryStorage::newEntity(psVar3,(string *)local_90);
  if (lVar4 == 0) {
    psVar3 = (string *)0x0;
  }
  else {
    psVar3 = (string *)
             __dynamic_cast(lVar4,&dynamicgraph::Entity::typeinfo,&dynamicgraph::Tracer::typeinfo,0)
    ;
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  psVar5 = (string *)dynamicgraph::FactoryStorage::getInstance();
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"MyEntity","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"my-entity","");
  psVar5 = (string *)dynamicgraph::FactoryStorage::newEntity(psVar5,(string *)local_90);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/tmp","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"my-tracer","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".dat","");
  dynamicgraph::Tracer::openFiles(psVar3,(string *)local_90,(string *)local_b0);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"my-entity.out_double","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"output","");
  dynamicgraph::Tracer::addSignalToTraceByName(psVar3,(string *)&local_d0);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"my-entity.out_vector","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"output-vector","");
  dynamicgraph::Tracer::addSignalToTraceByName(psVar3,(string *)&local_d0);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"out2double","");
  psVar6 = (string *)dynamicgraph::Entity::getSignal(psVar5);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"in_double","");
  uVar7 = dynamicgraph::Entity::getSignal(psVar5);
  plVar8 = (long *)__dynamic_cast(uVar7,&dynamicgraph::SignalBase<int>::typeinfo,
                                  &dynamicgraph::Signal<double,int>::typeinfo,0);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"out_vector","");
  uVar7 = dynamicgraph::Entity::getSignal(psVar5);
  plVar9 = (long *)__dynamic_cast(uVar7,&dynamicgraph::SignalBase<int>::typeinfo,
                                  &dynamicgraph::Signal<Eigen::Matrix<double,-1,1,0,-1,1>,int>::
                                   typeinfo,0);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"output2","");
  dynamicgraph::Tracer::addSignalToTrace((SignalBase *)psVar3,psVar6);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  local_d0._0_4_ = 0;
  local_d0._4_4_ = 0x3ff80000;
  (**(code **)(*plVar8 + 0xc0))(plVar8);
  psVar3[0x1c0] = (string)0x1;
  local_d0._0_4_ = 0;
  do {
    (**(code **)(*(long *)psVar6 + 0x18))(psVar6,&local_d0);
    (**(code **)(*plVar8 + 0xe0))(plVar8,&local_d0);
    (**(code **)(*plVar8 + 0x18))(plVar8,&local_d0);
    (**(code **)(*plVar9 + 0x98))(plVar9,&local_d0);
    (**(code **)(*plVar9 + 0x18))(plVar9,&local_d0);
    dynamicgraph::Tracer::recordTrigger((int *)psVar3,(int *)&local_d0);
    iVar1 = (int)local_d0 + 1;
    bVar2 = (int)local_d0 < 999;
    local_d0._0_4_ = iVar1;
  } while (bVar2);
  psVar3[0x1c0] = (string)0x0;
  dynamicgraph::Tracer::clearSignalToTrace();
  (**(code **)(*(long *)psVar3 + 0x48))(psVar3);
  dynamicgraph::Tracer::record();
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_tracer) {
  using dynamicgraph::Vector;

  // Creates a tracer.
  dynamicgraph::Tracer &atracer = *dynamic_cast<dynamicgraph::Tracer *>(
      dynamicgraph::FactoryStorage::getInstance()->newEntity("Tracer",
                                                             "my-tracer"));

  dynamicgraph::Entity &entity =
      *dynamicgraph::FactoryStorage::getInstance()->newEntity("MyEntity",
                                                              "my-entity");

  std::string rootdir("/tmp");
  std::string basename("my-tracer");
  std::string suffix(".dat");

  /// Test openfiles
  atracer.openFiles(rootdir, basename, suffix);

  /// Add trace by name
  atracer.addSignalToTraceByName("my-entity.out_double", "output");
  /// Add trace by name
  atracer.addSignalToTraceByName("my-entity.out_vector", "output-vector");

  dynamicgraph::SignalBase<int> &aSignal = entity.getSignal("out2double");

  dynamicgraph::Signal<double, int> &aSignalInt =
      *(dynamic_cast<dynamicgraph::Signal<double, int> *>(
          &entity.getSignal("in_double")));

  dynamicgraph::Signal<Vector, int> &aSignalVector =
      *(dynamic_cast<dynamicgraph::Signal<Vector, int> *>(
          &entity.getSignal("out_vector")));

  /// Add trace by signal object
  atracer.addSignalToTrace(aSignal, "output2");

  aSignalInt.setConstant(1.5);

  atracer.start();

  for (int i = 0; i < 1000; i++) {
    aSignal.setTime(i);
    aSignalInt.access(i);
    aSignalInt.setTime(i);
    aSignalVector.recompute(i);
    aSignalVector.setTime(i);
    atracer.recordTrigger(i, i);
  }

  atracer.stop();
  atracer.clearSignalToTrace();
  atracer.closeFiles();

  atracer.record();
}